

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotoaddressdialog.h
# Opt level: O2

void __thiscall Ui_GoToAddressDialog::setupUi(Ui_GoToAddressDialog *this,QDialog *GoToAddressDialog)

{
  storage_type *psVar1;
  QVBoxLayout *pQVar2;
  QGroupBox *this_00;
  QHBoxLayout *pQVar3;
  QLabel *pQVar4;
  HexSpinBox *this_01;
  QDialogButtonBox *this_02;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QArrayDataPointer<char16_t> local_50;
  Object local_38 [8];
  Object local_30 [8];
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (local_50.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("GoToAddressDialog",0x12);
    QVar5.m_data = psVar1;
    QVar5.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar5);
    QObject::setObjectName((QString *)GoToAddressDialog);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QWidget::resize((QWidget *)GoToAddressDialog,0x10e,0x56);
  QDialog::setModal(SUB81(GoToAddressDialog,0));
  pQVar2 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar2,(QWidget *)GoToAddressDialog);
  this->verticalLayout = pQVar2;
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,5);
  pQVar2 = this->verticalLayout;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("verticalLayout",0xf);
  QVar6.m_data = psVar1;
  QVar6.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QLayout::setContentsMargins((int)this->verticalLayout,5,5,5);
  this_00 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(this_00,(QWidget *)GoToAddressDialog);
  this->groupBox = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("groupBox",9);
  QVar7.m_data = psVar1;
  QVar7.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar3 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar3,(QWidget *)this->groupBox);
  this->horizontalLayout = pQVar3;
  (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,5);
  pQVar3 = this->horizontalLayout;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("horizontalLayout",0x11);
  QVar8.m_data = psVar1;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QLayout::setContentsMargins((int)this->horizontalLayout,5,5,5);
  pQVar4 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar4,this->groupBox,0);
  this->label = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("label",6);
  QVar9.m_data = psVar1;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QBoxLayout::addWidget(this->horizontalLayout,this->label,0);
  this_01 = (HexSpinBox *)operator_new(0x38);
  HexSpinBox::HexSpinBox(this_01,(QWidget *)this->groupBox);
  this->hexSpinBox = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("hexSpinBox",0xb);
  QVar10.m_data = psVar1;
  QVar10.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->hexSpinBox,0));
  QBoxLayout::addWidget(this->horizontalLayout,this->hexSpinBox,0);
  QBoxLayout::addWidget(this->verticalLayout,this->groupBox,0);
  this_02 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(this_02,(QWidget *)GoToAddressDialog);
  this->buttonBox = this_02;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("buttonBox",10);
  QVar11.m_data = psVar1;
  QVar11.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QDialogButtonBox::setOrientation((Orientation)this->buttonBox);
  QDialogButtonBox::setStandardButtons(this->buttonBox,0x400400);
  QBoxLayout::addWidget(this->verticalLayout,this->buttonBox,0);
  retranslateUi(this,GoToAddressDialog);
  local_50.d = (Data *)0x1b9;
  local_50.ptr = (char16_t *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_30,(offset_in_QDialogButtonBox_to_subr)this->buttonBox,
             (Object *)QDialogButtonBox::accepted,0,(ConnectionType)GoToAddressDialog);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_50.d = (Data *)0x1c1;
  local_50.ptr = (char16_t *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_38,(offset_in_QDialogButtonBox_to_subr)this->buttonBox,
             (Object *)QDialogButtonBox::rejected,0,(ConnectionType)GoToAddressDialog);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QMetaObject::connectSlotsByName((QObject *)GoToAddressDialog);
  return;
}

Assistant:

void setupUi(QDialog *GoToAddressDialog)
    {
        if (GoToAddressDialog->objectName().isEmpty())
            GoToAddressDialog->setObjectName(QString::fromUtf8("GoToAddressDialog"));
        GoToAddressDialog->resize(270, 86);
        GoToAddressDialog->setModal(false);
        verticalLayout = new QVBoxLayout(GoToAddressDialog);
        verticalLayout->setSpacing(5);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        verticalLayout->setContentsMargins(5, 5, 5, 5);
        groupBox = new QGroupBox(GoToAddressDialog);
        groupBox->setObjectName(QString::fromUtf8("groupBox"));
        horizontalLayout = new QHBoxLayout(groupBox);
        horizontalLayout->setSpacing(5);
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        horizontalLayout->setContentsMargins(5, 5, 5, 5);
        label = new QLabel(groupBox);
        label->setObjectName(QString::fromUtf8("label"));

        horizontalLayout->addWidget(label);

        hexSpinBox = new HexSpinBox(groupBox);
        hexSpinBox->setObjectName(QString::fromUtf8("hexSpinBox"));
        QSizePolicy sizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(hexSpinBox->sizePolicy().hasHeightForWidth());
        hexSpinBox->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(hexSpinBox);


        verticalLayout->addWidget(groupBox);

        buttonBox = new QDialogButtonBox(GoToAddressDialog);
        buttonBox->setObjectName(QString::fromUtf8("buttonBox"));
        buttonBox->setOrientation(Qt::Horizontal);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        verticalLayout->addWidget(buttonBox);


        retranslateUi(GoToAddressDialog);
        QObject::connect(buttonBox, &QDialogButtonBox::accepted, GoToAddressDialog, qOverload<>(&QDialog::accept));
        QObject::connect(buttonBox, &QDialogButtonBox::rejected, GoToAddressDialog, qOverload<>(&QDialog::reject));

        QMetaObject::connectSlotsByName(GoToAddressDialog);
    }